

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_decompress.c
# Opt level: O0

size_t FSE_buildDTable_internal
                 (FSE_DTable *dt,short *normalizedCounter,uint maxSymbolValue,uint tableLog,
                 void *workSpace,size_t wkspSize)

{
  short sVar1;
  ushort uVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  byte bVar7;
  U32 nextState;
  int iStack_e4;
  BYTE symbol;
  U32 u_1;
  int i_1;
  U32 position_1;
  U32 s_3;
  U32 step_1;
  U32 tableMask_1;
  size_t uPosition;
  size_t u;
  size_t unroll;
  size_t s_2;
  size_t position;
  int local_a0;
  int n;
  int i;
  U32 s_1;
  U64 sv;
  size_t pos;
  U64 add;
  size_t step;
  size_t tableMask;
  U32 s;
  uint uStack_64;
  S16 largeLimit;
  FSE_DTableHeader DTableH;
  U32 highThreshold;
  U32 tableSize;
  U32 maxSV1;
  BYTE *spread;
  U16 *symbolNext;
  FSE_decode_t *tableDecode;
  void *tdPtr;
  size_t wkspSize_local;
  void *workSpace_local;
  uint tableLog_local;
  uint maxSymbolValue_local;
  short *normalizedCounter_local;
  FSE_DTable *dt_local;
  
  lVar3 = (ulong)maxSymbolValue * 2 + 2;
  uVar4 = maxSymbolValue + 1;
  bVar7 = (byte)tableLog;
  uVar5 = 1 << (bVar7 & 0x1f);
  uStack_64 = uVar5 - 1;
  if (wkspSize < (ulong)(maxSymbolValue + 1) * 2 + (1L << (bVar7 & 0x3f)) + 8) {
    dt_local = (FSE_DTable *)0xffffffffffffffd2;
  }
  else if (maxSymbolValue < 0x100) {
    if (tableLog < 0xd) {
      s = CONCAT22(1,(short)tableLog);
      for (tableMask._0_4_ = 0; (uint)tableMask < uVar4; tableMask._0_4_ = (uint)tableMask + 1) {
        if (normalizedCounter[(uint)tableMask] == -1) {
          *(char *)((long)dt + (ulong)uStack_64 * 4 + 6) = (char)(uint)tableMask;
          *(undefined2 *)((long)workSpace + (ulong)(uint)tableMask * 2) = 1;
          uStack_64 = uStack_64 - 1;
        }
        else {
          if ((short)(1 << (bVar7 - 1 & 0x1f)) <= normalizedCounter[(uint)tableMask]) {
            s = s & 0xffff;
          }
          *(short *)((long)workSpace + (ulong)(uint)tableMask * 2) =
               normalizedCounter[(uint)tableMask];
        }
      }
      *dt = s;
      if (uStack_64 == uVar5 - 1) {
        uVar6 = (ulong)((uVar5 >> 1) + (uVar5 >> 3) + 3);
        sv = 0;
        _i = 0;
        for (n = 0; (uint)n < uVar4; n = n + 1) {
          sVar1 = normalizedCounter[(uint)n];
          MEM_write64((void *)((long)workSpace + sv + lVar3),_i);
          for (local_a0 = 8; local_a0 < sVar1; local_a0 = local_a0 + 8) {
            MEM_write64((void *)((long)workSpace + (long)local_a0 + sv + lVar3),_i);
          }
          sv = (long)(int)sVar1 + sv;
          _i = _i + 0x101010101010101;
        }
        s_2 = 0;
        for (unroll = 0; unroll < uVar5; unroll = unroll + 2) {
          for (uPosition = 0; uPosition < 2; uPosition = uPosition + 1) {
            *(undefined1 *)((long)dt + (s_2 + uPosition * uVar6 & (ulong)(uVar5 - 1)) * 4 + 6) =
                 *(undefined1 *)((long)workSpace + unroll + uPosition + lVar3);
          }
          s_2 = s_2 + uVar6 * 2 & (ulong)(uVar5 - 1);
        }
      }
      else {
        u_1 = 0;
        for (i_1 = 0; (uint)i_1 < uVar4; i_1 = i_1 + 1) {
          for (iStack_e4 = 0; iStack_e4 < normalizedCounter[(uint)i_1]; iStack_e4 = iStack_e4 + 1) {
            *(char *)((long)dt + (ulong)u_1 * 4 + 6) = (char)i_1;
            do {
              u_1 = u_1 + (uVar5 >> 1) + (uVar5 >> 3) + 3 & uVar5 - 1;
            } while (uStack_64 < u_1);
          }
        }
        if (u_1 != 0) {
          return 0xffffffffffffffff;
        }
      }
      for (nextState = 0; nextState < uVar5; nextState = nextState + 1) {
        uVar6 = (ulong)*(byte *)((long)dt + (ulong)nextState * 4 + 6);
        uVar2 = *(ushort *)((long)workSpace + uVar6 * 2);
        *(ushort *)((long)workSpace + uVar6 * 2) = uVar2 + 1;
        uVar4 = BIT_highbit32((uint)uVar2);
        *(byte *)((long)dt + (ulong)nextState * 4 + 7) = bVar7 - (char)uVar4;
        *(ushort *)(dt + (ulong)nextState + 1) =
             (uVar2 << (*(byte *)((long)dt + (ulong)nextState * 4 + 7) & 0x1f)) - (short)uVar5;
      }
      dt_local = (FSE_DTable *)0x0;
    }
    else {
      dt_local = (FSE_DTable *)0xffffffffffffffd4;
    }
  }
  else {
    dt_local = (FSE_DTable *)0xffffffffffffffd2;
  }
  return (size_t)dt_local;
}

Assistant:

static size_t FSE_buildDTable_internal(FSE_DTable* dt, const short* normalizedCounter, unsigned maxSymbolValue, unsigned tableLog, void* workSpace, size_t wkspSize)
{
    void* const tdPtr = dt+1;   /* because *dt is unsigned, 32-bits aligned on 32-bits */
    FSE_DECODE_TYPE* const tableDecode = (FSE_DECODE_TYPE*) (tdPtr);
    U16* symbolNext = (U16*)workSpace;
    BYTE* spread = (BYTE*)(symbolNext + maxSymbolValue + 1);

    U32 const maxSV1 = maxSymbolValue + 1;
    U32 const tableSize = 1 << tableLog;
    U32 highThreshold = tableSize-1;

    /* Sanity Checks */
    if (FSE_BUILD_DTABLE_WKSP_SIZE(tableLog, maxSymbolValue) > wkspSize) return ERROR(maxSymbolValue_tooLarge);
    if (maxSymbolValue > FSE_MAX_SYMBOL_VALUE) return ERROR(maxSymbolValue_tooLarge);
    if (tableLog > FSE_MAX_TABLELOG) return ERROR(tableLog_tooLarge);

    /* Init, lay down lowprob symbols */
    {   FSE_DTableHeader DTableH;
        DTableH.tableLog = (U16)tableLog;
        DTableH.fastMode = 1;
        {   S16 const largeLimit= (S16)(1 << (tableLog-1));
            U32 s;
            for (s=0; s<maxSV1; s++) {
                if (normalizedCounter[s]==-1) {
                    tableDecode[highThreshold--].symbol = (FSE_FUNCTION_TYPE)s;
                    symbolNext[s] = 1;
                } else {
                    if (normalizedCounter[s] >= largeLimit) DTableH.fastMode=0;
                    symbolNext[s] = normalizedCounter[s];
        }   }   }
        ZSTD_memcpy(dt, &DTableH, sizeof(DTableH));
    }

    /* Spread symbols */
    if (highThreshold == tableSize - 1) {
        size_t const tableMask = tableSize-1;
        size_t const step = FSE_TABLESTEP(tableSize);
        /* First lay down the symbols in order.
         * We use a uint64_t to lay down 8 bytes at a time. This reduces branch
         * misses since small blocks generally have small table logs, so nearly
         * all symbols have counts <= 8. We ensure we have 8 bytes at the end of
         * our buffer to handle the over-write.
         */
        {
            U64 const add = 0x0101010101010101ull;
            size_t pos = 0;
            U64 sv = 0;
            U32 s;
            for (s=0; s<maxSV1; ++s, sv += add) {
                int i;
                int const n = normalizedCounter[s];
                MEM_write64(spread + pos, sv);
                for (i = 8; i < n; i += 8) {
                    MEM_write64(spread + pos + i, sv);
                }
                pos += n;
            }
        }
        /* Now we spread those positions across the table.
         * The benefit of doing it in two stages is that we avoid the the
         * variable size inner loop, which caused lots of branch misses.
         * Now we can run through all the positions without any branch misses.
         * We unroll the loop twice, since that is what emperically worked best.
         */
        {
            size_t position = 0;
            size_t s;
            size_t const unroll = 2;
            assert(tableSize % unroll == 0); /* FSE_MIN_TABLELOG is 5 */
            for (s = 0; s < (size_t)tableSize; s += unroll) {
                size_t u;
                for (u = 0; u < unroll; ++u) {
                    size_t const uPosition = (position + (u * step)) & tableMask;
                    tableDecode[uPosition].symbol = spread[s + u];
                }
                position = (position + (unroll * step)) & tableMask;
            }
            assert(position == 0);
        }
    } else {
        U32 const tableMask = tableSize-1;
        U32 const step = FSE_TABLESTEP(tableSize);
        U32 s, position = 0;
        for (s=0; s<maxSV1; s++) {
            int i;
            for (i=0; i<normalizedCounter[s]; i++) {
                tableDecode[position].symbol = (FSE_FUNCTION_TYPE)s;
                position = (position + step) & tableMask;
                while (position > highThreshold) position = (position + step) & tableMask;   /* lowprob area */
        }   }
        if (position!=0) return ERROR(GENERIC);   /* position must reach all cells once, otherwise normalizedCounter is incorrect */
    }

    /* Build Decoding table */
    {   U32 u;
        for (u=0; u<tableSize; u++) {
            FSE_FUNCTION_TYPE const symbol = (FSE_FUNCTION_TYPE)(tableDecode[u].symbol);
            U32 const nextState = symbolNext[symbol]++;
            tableDecode[u].nbBits = (BYTE) (tableLog - BIT_highbit32(nextState) );
            tableDecode[u].newState = (U16) ( (nextState << tableDecode[u].nbBits) - tableSize);
    }   }

    return 0;
}